

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_parser.cpp
# Opt level: O2

void AppendTreeNodeSibling(ZCC_TreeNode *thisnode,ZCC_TreeNode *sibling)

{
  ZCC_TreeNode *pZVar1;
  
  if (thisnode == (ZCC_TreeNode *)0x0) {
    I_FatalError("Internal script compiler error. Execution aborted.");
  }
  if (sibling != (ZCC_TreeNode *)0x0) {
    if (thisnode->SiblingPrev->SiblingNext != thisnode) {
      __assert_fail("SiblingPrev->SiblingNext == thisnode",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/zscript/zcc_parser.cpp"
                    ,500,"void AppendTreeNodeSibling(ZCC_TreeNode *, ZCC_TreeNode *)");
    }
    if (thisnode->SiblingNext->SiblingPrev != thisnode) {
      __assert_fail("SiblingNext->SiblingPrev == thisnode",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/zscript/zcc_parser.cpp"
                    ,0x1f5,"void AppendTreeNodeSibling(ZCC_TreeNode *, ZCC_TreeNode *)");
    }
    pZVar1 = sibling->SiblingPrev;
    if (pZVar1->SiblingNext != sibling) {
      __assert_fail("sibling->SiblingPrev->SiblingNext == sibling",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/zscript/zcc_parser.cpp"
                    ,0x1f8,"void AppendTreeNodeSibling(ZCC_TreeNode *, ZCC_TreeNode *)");
    }
    if (sibling->SiblingNext->SiblingPrev != sibling) {
      __assert_fail("sibling->SiblingNext->SiblingPrev == sibling",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/zscript/zcc_parser.cpp"
                    ,0x1f9,"void AppendTreeNodeSibling(ZCC_TreeNode *, ZCC_TreeNode *)");
    }
    thisnode->SiblingPrev->SiblingNext = sibling;
    sibling->SiblingPrev = thisnode->SiblingPrev;
    thisnode->SiblingPrev = pZVar1;
    pZVar1->SiblingNext = thisnode;
  }
  return;
}

Assistant:

void AppendTreeNodeSibling(ZCC_TreeNode *thisnode, ZCC_TreeNode *sibling)
{
		if (thisnode == nullptr)
		{
			// Some bad syntax can actually get here, so better abort so that the user can see the error which caused this.
			I_FatalError("Internal script compiler error. Execution aborted.");
		}
		if (sibling == nullptr)
		{
			return;
		}

		ZCC_TreeNode *&SiblingPrev = thisnode->SiblingPrev;
		ZCC_TreeNode *&SiblingNext = thisnode->SiblingNext;

		// Check integrity of our sibling list.
		assert(SiblingPrev->SiblingNext == thisnode);
		assert(SiblingNext->SiblingPrev == thisnode);

		// Check integrity of new sibling list.
		assert(sibling->SiblingPrev->SiblingNext == sibling);
		assert(sibling->SiblingNext->SiblingPrev == sibling);

		ZCC_TreeNode *siblingend = sibling->SiblingPrev;
		SiblingPrev->SiblingNext = sibling;
		sibling->SiblingPrev = SiblingPrev;
		SiblingPrev = siblingend;
		siblingend->SiblingNext = thisnode;
}